

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O0

void lchange(int flag)

{
  mgwin *local_18;
  mgwin *wp;
  int flag_local;
  
  wp._4_1_ = (byte)flag;
  if ((curbp->b_flag & 1U) == 0) {
    wp._4_1_ = wp._4_1_ | 0x10;
    curbp->b_flag = curbp->b_flag | 1;
  }
  for (local_18 = wheadp; local_18 != (mgwin *)0x0; local_18 = (local_18->w_list).l_p.l_wp) {
    if ((local_18->w_bufp == curbp) &&
       (local_18->w_rflag = local_18->w_rflag | wp._4_1_, local_18 != curwp)) {
      local_18->w_rflag = local_18->w_rflag | 8;
    }
  }
  return;
}

Assistant:

void
lchange(int flag)
{
	struct mgwin	*wp;

	/* update mode lines if this is the first change. */
	if ((curbp->b_flag & BFCHG) == 0) {
		flag |= WFMODE;
		curbp->b_flag |= BFCHG;
	}
	for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
		if (wp->w_bufp == curbp) {
			wp->w_rflag |= flag;
			if (wp != curwp)
				wp->w_rflag |= WFFULL;
		}
	}
}